

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O0

void size_callback(GLFWwindow *window,int width,int height)

{
  undefined8 in_R8;
  undefined8 in_R9;
  int height_local;
  int width_local;
  GLFWwindow *window_local;
  
  glfwGetFramebufferSize(window,&Width_global,&Height_global);
  glViewport(0,0,Width_global,Height_global,in_R8,in_R9,height);
  glMatrixMode(0x1701);
  glLoadIdentity();
  glOrtho(0,(double)Width_global,0,(double)Height_global,0x3ff0000000000000,0xbff0000000000000);
  display(window);
  return;
}

Assistant:

void size_callback(GLFWwindow* window, int width, int height)
{
    // The width and height arguments are not used
    // because they are not the size of the window 
    // in pixels.

    // Get the pixel coordinate of the window
    // it returns the size, in pixels, of the 
    // framebuffer of the specified window
    glfwGetFramebufferSize(window, &Width_global, &Height_global);
    
    glViewport(0, 0, Width_global, Height_global);
    glMatrixMode(GL_PROJECTION);
    glLoadIdentity();
    glOrtho(0, Width_global, 0, Height_global, 1, -1);
    
    display(window);
}